

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O1

bool RigidBodyDynamics::Math::SpatialVectorCompareEpsilon
               (SpatialVector *vector_a,SpatialVector *vector_b,Scalar epsilon)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  bool bVar4;
  
  if (epsilon <=
      ABS((vector_a->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] -
          (vector_b->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0])) {
    bVar4 = false;
  }
  else {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 5) {
        return 4 < uVar2;
      }
      uVar1 = uVar2 + 1;
    } while (ABS((vector_a->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [uVar2 + 1] -
                 (vector_b->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [uVar2 + 1]) < epsilon);
    bVar4 = 4 < uVar2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected:",9);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
  std::ostream::put(-0x78);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)vector_a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"but was",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)vector_b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return bVar4;
}

Assistant:

RBDL_DLLAPI bool SpatialVectorCompareEpsilon (
    const SpatialVector &vector_a, 
    const SpatialVector &vector_b, 
    Scalar epsilon) {
  assert (epsilon >= Scalar(0.));
  unsigned int i;

  for (i = 0; i < 6; i++) {
    if (Scalar(fabs(vector_a[i] - vector_b[i])) >= Scalar(epsilon)) {
      std::cerr << "Expected:" 
        << std::endl << vector_a << std::endl
        << "but was" << std::endl 
        << vector_b << std::endl;
      return false;
    }
  }

  return true;
}